

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Answer * __thiscall
capnp::_::anon_unknown_18::
ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::erase
          (Answer *__return_storage_ptr__,
          ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer> *this,
          uint id)

{
  size_t sVar1;
  Answer *pAVar2;
  Entry local_e0;
  Entry *local_90;
  Entry *entry;
  Entry *local_80;
  Entry *_entry369;
  Answer local_68;
  undefined1 local_1d;
  uint local_1c;
  ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer> *pIStack_18;
  uint id_local;
  ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer> *this_local;
  Answer *toRelease;
  
  local_1c = id;
  pIStack_18 = this;
  this_local = (ImportTable<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer> *)
               __return_storage_ptr__;
  sVar1 = kj::size<capnp::_::RpcSystemBase::RpcConnectionState::Answer,16ul>(this->low);
  if (id < sVar1) {
    local_1d = 0;
    pAVar2 = kj::mv<capnp::_::RpcSystemBase::RpcConnectionState::Answer>(this->low + local_1c);
    RpcSystemBase::RpcConnectionState::Answer::Answer(__return_storage_ptr__,pAVar2);
    local_68.resultExports.ptr = (uint *)0x0;
    local_68.resultExports.size_ = 0;
    local_68.task.field_1._8_8_ = 0;
    local_68.callContext.ptr = (RpcCallContext *)0x0;
    local_68.task.tag = 0;
    local_68.task._4_4_ = 0;
    local_68.task.field_1._0_8_ = 0;
    local_68.pipeline.ptr.disposer = (Disposer *)0x0;
    local_68.pipeline.ptr.ptr = (PipelineHook *)0x0;
    local_68.resultExports.disposer = (ArrayDisposer *)0x0;
    RpcSystemBase::RpcConnectionState::Answer::Answer(&local_68);
    RpcSystemBase::RpcConnectionState::Answer::operator=(this->low + local_1c,&local_68);
    RpcSystemBase::RpcConnectionState::Answer::~Answer(&local_68);
    this->presenceBits = (1 << ((byte)local_1c & 0x1f) ^ 0xffffffffU) & this->presenceBits;
  }
  else {
    kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Answer>::
    findEntry<unsigned_int&>
              ((HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Answer> *)&entry,
               (uint *)&this->high);
    local_90 = kj::_::
               readMaybe<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry>
                         ((Maybe<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry_&>
                           *)&entry);
    local_80 = local_90;
    if (local_90 == (Entry *)0x0) {
      memset(__return_storage_ptr__,0,0x48);
      RpcSystemBase::RpcConnectionState::Answer::Answer(__return_storage_ptr__);
    }
    else {
      kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::release
                (&local_e0,&this->high,local_90);
      RpcSystemBase::RpcConnectionState::Answer::Answer(__return_storage_ptr__,&local_e0.value);
      kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Answer>::Entry::~Entry
                (&local_e0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T erase(Id id) {
    // Remove an entry from the table and return it.  We return it so that the caller can be
    // careful to release it (possibly invoking arbitrary destructors) at a time that makes sense.
    if (id < kj::size(low)) {
      T toRelease = kj::mv(low[id]);
      low[id] = T();
      presenceBits &= ~(1 << id);
      return toRelease;
    } else {
      KJ_IF_SOME(entry, high.findEntry(id)) {
        return high.release(entry).value;
      } else {
        return {};
      }
    }